

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::IsImportedSharedLibWithoutSOName(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  ImportInfo *pIVar4;
  ImportInfo *pIVar5;
  
  bVar1 = cmTarget::IsImported(this->Target);
  if (bVar1) {
    TVar3 = cmTarget::GetType(this->Target);
    if (TVar3 == SHARED_LIBRARY) {
      pIVar4 = GetImportInfo(this,config);
      pIVar5 = pIVar4;
      if (pIVar4 != (ImportInfo *)0x0) {
        pIVar5 = (ImportInfo *)(ulong)pIVar4->NoSOName;
      }
      bVar2 = (byte)pIVar5;
      if (pIVar4 != (ImportInfo *)0x0) goto LAB_003a38bd;
    }
  }
  bVar2 = 0;
LAB_003a38bd:
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmGeneratorTarget::IsImportedSharedLibWithoutSOName(
  const std::string& config) const
{
  if (this->IsImported() && this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->NoSOName;
    }
  }
  return false;
}